

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O1

REF_STATUS
ref_oct_set_node_at_node
          (REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_INT insert_node,REF_DBL *xyz)

{
  REF_STATUS RVar1;
  REF_STATUS RVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  REF_DBL box [6];
  double local_68;
  double local_60;
  double local_58;
  
  dVar7 = bbox[1] - *bbox;
  RVar1 = 0;
  RVar2 = 0;
  if ((dVar7 * -0.0050000000000000044 + *bbox <= *xyz) &&
     (RVar2 = RVar1, *xyz <= dVar7 * 0.0050000000000000044 + bbox[1])) {
    dVar8 = bbox[3] - bbox[2];
    if ((dVar8 * -0.0050000000000000044 + bbox[2] <= xyz[1]) &&
       (xyz[1] <= dVar8 * 0.0050000000000000044 + bbox[3])) {
      dVar6 = bbox[5] - bbox[4];
      if ((dVar6 * -0.0050000000000000044 + bbox[4] <= xyz[2]) &&
         (xyz[2] <= dVar6 * 0.0050000000000000044 + bbox[5])) {
        if (ref_oct->children[node * 8] == -1) {
          dVar7 = dVar6 * dVar6 + dVar8 * dVar8 + dVar7 * dVar7;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          bVar4 = false;
          uVar3 = 0;
          RVar2 = 0;
          do {
            RVar1 = ref_oct_bbox_corner(bbox,(REF_INT)uVar3,&local_68);
            if (RVar1 != 0) {
              RVar2 = 1;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x1b6,"ref_oct_set_node_at_node",1,"corner xyz");
              break;
            }
            dVar8 = (xyz[2] - local_58) * (xyz[2] - local_58) +
                    (xyz[1] - local_60) * (xyz[1] - local_60) +
                    (*xyz - local_68) * (*xyz - local_68);
            if (dVar8 < 0.0) {
              dVar8 = sqrt(dVar8);
            }
            else {
              dVar8 = SQRT(dVar8);
            }
            if (dVar8 < dVar7 * 0.1) {
              ref_oct->nodes[(long)(node * 0x1b) + uVar3] = insert_node;
            }
            bVar4 = 0x19 < uVar3;
            uVar3 = uVar3 + 1;
          } while (uVar3 != 0x1b);
        }
        else {
          bVar4 = false;
          uVar3 = 0;
          RVar2 = 0;
          do {
            RVar1 = ref_oct_child_bbox(bbox,(REF_INT)uVar3,&local_68);
            if (RVar1 == 0) {
              if (ref_oct->children[(long)(node * 8) + uVar3] == node) {
                bVar5 = false;
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                       ,0x1c2,"ref_oct_set_node_at_node","same");
                RVar2 = 1;
              }
              else {
                RVar1 = ref_oct_set_node_at_node
                                  (ref_oct,ref_oct->children[(long)(node * 8) + uVar3],&local_68,
                                   insert_node,xyz);
                bVar5 = RVar1 == 0;
                if (!bVar5) {
                  bVar5 = false;
                  RVar2 = 1;
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                         ,0x1c6,"ref_oct_set_node_at_node",1,"recurse");
                }
              }
            }
            else {
              RVar2 = 1;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x1c1,"ref_oct_set_node_at_node",1,"bbox");
              bVar5 = false;
            }
            if (!bVar5) break;
            bVar4 = 6 < uVar3;
            uVar3 = uVar3 + 1;
          } while (uVar3 != 8);
        }
        if (bVar4) {
          RVar2 = 0;
        }
      }
    }
  }
  return RVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_set_node_at_node(REF_OCT ref_oct,
                                                   REF_INT node, REF_DBL *bbox,
                                                   REF_INT insert_node,
                                                   REF_DBL *xyz) {
  REF_DBL fuzz[6], point[6], expand = 1.01;
  REF_BOOL overlap;

  point[0] = xyz[0];
  point[1] = xyz[0];
  point[2] = xyz[1];
  point[3] = xyz[1];
  point[4] = xyz[2];
  point[5] = xyz[2];
  RSS(ref_oct_bbox_scale(bbox, expand, fuzz), "scale bbox");
  RSS(ref_oct_bbox_overlap(point, fuzz, &overlap), "overlap");
  if (!overlap) return REF_SUCCESS;

  if (ref_oct_leaf_node(ref_oct, node)) {
    REF_INT corner;
    REF_DBL h;
    RSS(ref_oct_bbox_diag(bbox, &h), "diag");
    for (corner = 0; corner < 27; corner++) {
      REF_DBL my_xyz[3], dist, tol = 0.1;
      RSS(ref_oct_bbox_corner(bbox, corner, my_xyz), "corner xyz");
      dist = sqrt(pow(xyz[0] - my_xyz[0], 2) + pow(xyz[1] - my_xyz[1], 2) +
                  pow(xyz[2] - my_xyz[2], 2));
      if (dist < tol * h) {
        ref_oct_c2n(ref_oct, corner, node) = insert_node;
      }
    }
  } else {
    REF_INT child_index;
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RUS(node, ref_oct_child(ref_oct, child_index, node), "same");
      RSS(ref_oct_set_node_at_node(ref_oct,
                                   ref_oct_child(ref_oct, child_index, node),
                                   box, insert_node, xyz),
          "recurse");
    }
  }
  return REF_SUCCESS;
}